

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

function<bool_(unsigned_int)> *
spvOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode)

{
  int32_t iVar1;
  anon_class_1_0_00000001 local_26;
  anon_class_1_0_00000001 local_25;
  anon_class_1_0_00000001 local_24;
  anon_class_1_0_00000001 local_23;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  anon_class_1_0_00000001 local_20;
  anon_class_1_0_00000001 local_1f;
  anon_class_1_0_00000001 local_1e;
  anon_class_1_0_00000001 local_1d [7];
  anon_class_1_0_00000001 local_16;
  undefined1 local_15;
  Op local_14;
  function<bool_(unsigned_int)> *pfStack_10;
  Op opcode_local;
  function<bool_(unsigned_int)> *out;
  
  local_15 = 0;
  local_14 = opcode;
  pfStack_10 = __return_storage_ptr__;
  std::function<bool_(unsigned_int)>::function(__return_storage_ptr__);
  iVar1 = spvOpcodeGeneratesType(local_14);
  if (iVar1 != 0) {
    std::function<bool(unsigned_int)>::operator=
              ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_16);
    return __return_storage_ptr__;
  }
  if ((1 < local_14 - OpName) && (1 < local_14 - OpEntryPoint)) {
    if (local_14 == OpTypeArray) {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_25);
      return __return_storage_ptr__;
    }
    if (local_14 == OpTypeForwardPointer) {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_24);
      return __return_storage_ptr__;
    }
    if (local_14 == OpFunctionCall) {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_1f);
      return __return_storage_ptr__;
    }
    if (1 < local_14 - OpDecorate) {
      if (local_14 - OpGroupDecorate < 2) {
LAB_004be042:
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_1e);
        return __return_storage_ptr__;
      }
      if (local_14 == OpPhi) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_20);
        return __return_storage_ptr__;
      }
      if ((1 < local_14 - OpLoopMerge) && (local_14 != OpBranch)) {
        if (local_14 - OpBranchConditional < 2) goto LAB_004be042;
        if (local_14 == OpEnqueueKernel) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_21);
          return __return_storage_ptr__;
        }
        if (local_14 - OpGetKernelNDrangeSubGroupCount < 2) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_22);
          return __return_storage_ptr__;
        }
        if (local_14 - OpGetKernelWorkGroupSize < 2) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_23);
          return __return_storage_ptr__;
        }
        if ((1 < local_14 - OpExecutionModeId) &&
           (local_14 != OpDecorateString && local_14 != OpMemberDecorateString)) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_26);
          return __return_storage_ptr__;
        }
      }
    }
  }
  std::function<bool(unsigned_int)>::operator=
            ((function<bool(unsigned_int)> *)__return_storage_ptr__,local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvOperandCanBeForwardDeclaredFunction(
    spv::Op opcode) {
  std::function<bool(unsigned index)> out;
  if (spvOpcodeGeneratesType(opcode)) {
    // All types can use forward pointers.
    out = [](unsigned) { return true; };
    return out;
  }
  switch (opcode) {
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
    case spv::Op::OpEntryPoint:
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSelectionMerge:
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
    case spv::Op::OpBranch:
    case spv::Op::OpLoopMerge:
      out = [](unsigned) { return true; };
      break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      out = [](unsigned index) { return index != 0; };
      break;

    case spv::Op::OpFunctionCall:
      // The Function parameter.
      out = [](unsigned index) { return index == 2; };
      break;

    case spv::Op::OpPhi:
      out = [](unsigned index) { return index > 1; };
      break;

    case spv::Op::OpEnqueueKernel:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 8; };
      break;

    case spv::Op::OpGetKernelNDrangeSubGroupCount:
    case spv::Op::OpGetKernelNDrangeMaxSubGroupSize:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 3; };
      break;

    case spv::Op::OpGetKernelWorkGroupSize:
    case spv::Op::OpGetKernelPreferredWorkGroupSizeMultiple:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 2; };
      break;
    case spv::Op::OpTypeForwardPointer:
      out = [](unsigned index) { return index == 0; };
      break;
    case spv::Op::OpTypeArray:
      out = [](unsigned index) { return index == 1; };
      break;
    default:
      out = [](unsigned) { return false; };
      break;
  }
  return out;
}